

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3DbMallocRawNN(sqlite3 *db,u64 n)

{
  u32 *puVar1;
  LookasideSlot *pLVar2;
  void *pvVar3;
  
  if ((db->lookaside).sz < n) {
    if ((db->lookaside).bDisable == 0) {
      puVar1 = (db->lookaside).anStat + 1;
      *puVar1 = *puVar1 + 1;
      pvVar3 = dbMallocRawFinish(db,n);
      return pvVar3;
    }
    if (db->mallocFailed != '\0') {
      return (void *)0x0;
    }
    pvVar3 = sqlite3Malloc(n);
    if (pvVar3 == (void *)0x0) {
      sqlite3OomFault(db);
    }
    return pvVar3;
  }
  if (n < 0x81) {
    pLVar2 = (db->lookaside).pSmallFree;
    if (pLVar2 != (LookasideSlot *)0x0) {
      (db->lookaside).pSmallFree = pLVar2->pNext;
      goto LAB_00126749;
    }
    pLVar2 = (db->lookaside).pSmallInit;
    if (pLVar2 != (LookasideSlot *)0x0) {
      (db->lookaside).pSmallInit = pLVar2->pNext;
      goto LAB_00126749;
    }
  }
  pLVar2 = (db->lookaside).pFree;
  if (pLVar2 == (LookasideSlot *)0x0) {
    pLVar2 = (db->lookaside).pInit;
    if (pLVar2 == (LookasideSlot *)0x0) {
      puVar1 = (db->lookaside).anStat + 2;
      *puVar1 = *puVar1 + 1;
      pvVar3 = dbMallocRawFinish(db,n);
      return pvVar3;
    }
    (db->lookaside).pInit = pLVar2->pNext;
  }
  else {
    (db->lookaside).pFree = pLVar2->pNext;
  }
LAB_00126749:
  puVar1 = (db->lookaside).anStat;
  *puVar1 = *puVar1 + 1;
  return pLVar2;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRawNN(sqlite3 *db, u64 n){
#ifndef SQLITE_OMIT_LOOKASIDE
  LookasideSlot *pBuf;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( n>db->lookaside.sz ){
    if( !db->lookaside.bDisable ){
      db->lookaside.anStat[1]++;
    }else if( db->mallocFailed ){
      return 0;
    }
    return dbMallocRawFinish(db, n);
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( n<=LOOKASIDE_SMALL ){
    if( (pBuf = db->lookaside.pSmallFree)!=0 ){
      db->lookaside.pSmallFree = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }else if( (pBuf = db->lookaside.pSmallInit)!=0 ){
      db->lookaside.pSmallInit = pBuf->pNext;
      db->lookaside.anStat[0]++;
      return (void*)pBuf;
    }
  }
#endif
  if( (pBuf = db->lookaside.pFree)!=0 ){
    db->lookaside.pFree = pBuf->pNext;
    db->lookaside.anStat[0]++;
    return (void*)pBuf;
  }else if( (pBuf = db->lookaside.pInit)!=0 ){
    db->lookaside.pInit = pBuf->pNext;
    db->lookaside.anStat[0]++;
    return (void*)pBuf;
  }else{
    db->lookaside.anStat[2]++;
  }
#else
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->mallocFailed ){
    return 0;
  }
#endif
  return dbMallocRawFinish(db, n);
}